

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

int fiobj_iseq(FIOBJ o,FIOBJ o2)

{
  int iVar1;
  fiobj_object_vtable_s *pfVar2;
  size_t sVar3;
  uintptr_t uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 1;
  iVar1 = iVar5;
  if (o != o2) {
    iVar6 = 0;
    iVar1 = 0;
    if ((((o2 != 0) && ((~(uint)o2 & 6) != 0)) && (iVar1 = iVar6, ((uint)o & 6) != 6)) &&
       (((((uint)o2 | (uint)o) & 1) == 0 &&
        (*(char *)(o & 0xfffffffffffffff8) == *(char *)(o2 & 0xfffffffffffffff8))))) {
      pfVar2 = fiobj_type_vtable(o);
      sVar3 = (*pfVar2->is_eq)(o,o2);
      if ((sVar3 != 0) &&
         ((pfVar2 = fiobj_type_vtable(o), iVar1 = iVar5,
          pfVar2->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0 &&
          (uVar4 = (*pfVar2->count)(o), uVar4 != 0)))) {
        iVar1 = fiobj_iseq____internal_complex__(o,o2);
        return iVar1;
      }
    }
  }
  return iVar1;
}

Assistant:

FIO_INLINE int fiobj_iseq(const FIOBJ o, const FIOBJ o2) {
  if (o == o2)
    return 1;
  if (!o || !o2)
    return 0; /* they should have compared equal before. */
  if (!FIOBJ_IS_ALLOCATED(o) || !FIOBJ_IS_ALLOCATED(o2))
    return 0; /* they should have compared equal before. */
  if (FIOBJECT2HEAD(o)->type != FIOBJECT2HEAD(o2)->type)
    return 0; /* non-type equality is a barriar to equality. */
  if (!FIOBJECT2VTBL(o)->is_eq(o, o2))
    return 0;
  if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
    return fiobj_iseq____internal_complex__((FIOBJ)o, (FIOBJ)o2);
  return 1;
}